

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

double CECoordinates::DMSToAngle
                 (vector<double,_std::allocator<double>_> *angle,CEAngleType *return_type)

{
  double dVar1;
  CEAngle ret_angle;
  CEAngle local_38;
  CEAngle local_28;
  double local_18;
  
  CEAngle::Dms(&local_28,angle);
  local_18 = CEAngle::operator_cast_to_double(&local_28);
  CEAngle::CEAngle(&local_38,&local_18);
  CEAngle::~CEAngle(&local_28);
  if (*return_type == DEGREES) {
    dVar1 = CEAngle::Deg(&local_38);
  }
  else {
    dVar1 = CEAngle::Rad(&local_38);
  }
  CEAngle::~CEAngle(&local_38);
  return dVar1;
}

Assistant:

double CECoordinates::DMSToAngle(const std::vector<double>& angle,
                                 const CEAngleType& return_type)
{
    CEAngle ret_angle = CEAngle::Dms(angle);
    
    if (return_type == CEAngleType::DEGREES) {
        return ret_angle.Deg();
    } else {
        return ret_angle.Rad();
    }
}